

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O3

Name __thiscall
wasm::Outlining::addOutlinedFunction
          (Outlining *this,Module *module,RepeatedSubstring *substring,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *exprs)

{
  uint uVar1;
  char *pcVar2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar3;
  HeapType type;
  ulong uVar4;
  string_view sVar5;
  Name NVar6;
  Name NVar7;
  Signature sig_00;
  HeapType local_98;
  char *local_90;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *local_88;
  Module *local_80;
  StackSignature local_78;
  HeapType local_60;
  undefined1 auStack_58 [8];
  StackSignature sig;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  
  uVar1 = *(substring->StartIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)uVar1;
  local_88 = exprs;
  auStack_58 = (undefined1  [8])&sig.results;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"outline$","");
  sVar5._M_str = (char *)0x0;
  sVar5._M_len = (size_t)auStack_58;
  sVar5 = IString::interned((IString *)sig.params.id,sVar5,SUB81(exprs,0));
  NVar6 = Names::getValidFunctionName(module,(Name)sVar5);
  local_60.id = NVar6.super_IString.str._M_str;
  local_90 = NVar6.super_IString.str._M_len;
  if (auStack_58 != (undefined1  [8])&sig.results) {
    operator_delete((void *)auStack_58,CONCAT44(sig.results.id._4_4_,(undefined4)sig.results.id) + 1
                   );
  }
  pvVar3 = local_88;
  auStack_58 = (undefined1  [8])0x0;
  sig.params.id = 0;
  sig.results.id._0_4_ = 0;
  if (uVar1 < substring->Length + uVar1) {
    local_80 = module;
    do {
      StackSignature::StackSignature
                (&local_78,
                 (pvVar3->
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar4]);
      StackSignature::operator+=((StackSignature *)auStack_58,&local_78);
      uVar4 = uVar4 + 1;
      module = local_80;
    } while (uVar4 < substring->Length + uVar1);
  }
  type.id = local_60.id;
  sig_00.results.id = sig.params.id;
  sig_00.params.id = (uintptr_t)auStack_58;
  HeapType::HeapType(&local_98,sig_00);
  pcVar2 = local_90;
  local_78.params.id = 0;
  local_78.results.id = 0;
  local_78._16_8_ = 0;
  NVar6.super_IString.str._M_str = local_90;
  NVar6.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeFunction
            (NVar6,type,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_98.id,
             (Expression *)&local_78);
  Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                             &local_38);
  if (local_38._M_head_impl != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_38,local_38._M_head_impl);
  }
  local_38._M_head_impl = (Function *)0x0;
  if ((void *)local_78.params.id != (void *)0x0) {
    operator_delete((void *)local_78.params.id,local_78._16_8_ - local_78.params.id);
  }
  NVar7.super_IString.str._M_str = (char *)type.id;
  NVar7.super_IString.str._M_len = (size_t)pcVar2;
  return (Name)NVar7.super_IString.str;
}

Assistant:

Name addOutlinedFunction(Module* module,
                           const SuffixTree::RepeatedSubstring& substring,
                           const std::vector<Expression*>& exprs) {
    auto startIdx = substring.StartIndices[0];
    // The outlined functions can be named anything.
    Name func = Names::getValidFunctionName(*module, std::string("outline$"));
    // Calculate the function signature for the outlined sequence.
    StackSignature sig;
    for (uint32_t exprIdx = startIdx; exprIdx < startIdx + substring.Length;
         exprIdx++) {
      sig += StackSignature(exprs[exprIdx]);
    }
    module->addFunction(
      Builder::makeFunction(func, Signature(sig.params, sig.results), {}));
    return func;
  }